

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

void __thiscall
rr::FragmentProcessor::executeStencilDpFailAndPass
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,StencilState *stencilState,int numStencilBits,
          PixelBufferAccess *stencilBuffer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Fragment *pFVar6;
  int stencilBufferValue_15;
  Fragment *frag_15;
  int local_198;
  int fragSampleNdx_15;
  int regSampleNdx_15;
  int stencilBufferValue_14;
  Fragment *frag_14;
  int local_180;
  int fragSampleNdx_14;
  int regSampleNdx_14;
  int stencilBufferValue_13;
  Fragment *frag_13;
  int local_168;
  int fragSampleNdx_13;
  int regSampleNdx_13;
  int stencilBufferValue_12;
  Fragment *frag_12;
  int local_150;
  int fragSampleNdx_12;
  int regSampleNdx_12;
  int stencilBufferValue_11;
  Fragment *frag_11;
  int local_138;
  int fragSampleNdx_11;
  int regSampleNdx_11;
  int stencilBufferValue_10;
  Fragment *frag_10;
  int local_120;
  int fragSampleNdx_10;
  int regSampleNdx_10;
  int stencilBufferValue_9;
  Fragment *frag_9;
  int local_108;
  int fragSampleNdx_9;
  int regSampleNdx_9;
  int stencilBufferValue_8;
  Fragment *frag_8;
  int local_f0;
  int fragSampleNdx_8;
  int regSampleNdx_8;
  int stencilBufferValue_7;
  Fragment *frag_7;
  int local_d8;
  int fragSampleNdx_7;
  int regSampleNdx_7;
  int stencilBufferValue_6;
  Fragment *frag_6;
  int local_c0;
  int fragSampleNdx_6;
  int regSampleNdx_6;
  int stencilBufferValue_5;
  Fragment *frag_5;
  int local_a8;
  int fragSampleNdx_5;
  int regSampleNdx_5;
  int stencilBufferValue_4;
  Fragment *frag_4;
  int local_90;
  int fragSampleNdx_4;
  int regSampleNdx_4;
  int stencilBufferValue_3;
  Fragment *frag_3;
  int local_78;
  int fragSampleNdx_3;
  int regSampleNdx_3;
  int stencilBufferValue_2;
  Fragment *frag_2;
  int local_60;
  int fragSampleNdx_2;
  int regSampleNdx_2;
  int stencilBufferValue_1;
  Fragment *frag_1;
  int local_48;
  int fragSampleNdx_1;
  int regSampleNdx_1;
  int stencilBufferValue;
  Fragment *frag;
  int fragSampleNdx;
  int regSampleNdx;
  int clampedStencilRef;
  int numStencilBits_local;
  StencilState *stencilState_local;
  Fragment *inputFragments_local;
  int numSamplesPerFragment_local;
  int fragNdxOffset_local;
  FragmentProcessor *this_local;
  
  regSampleNdx._0_1_ = (byte)numStencilBits;
  iVar1 = de::clamp<int>(stencilState->ref,0,(1 << ((byte)regSampleNdx & 0x1f)) + -1);
  switch(stencilState->dpFail) {
  case STENCILOP_KEEP:
    for (frag._4_4_ = 0; frag._4_4_ < 0x40; frag._4_4_ = frag._4_4_ + 1) {
      if (((this->m_sampleRegister[frag._4_4_].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[frag._4_4_].depthPassed & 1U) == 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + frag._4_4_ / numSamplesPerFragment);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        iVar2 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           frag._4_4_ % numSamplesPerFragment,iVar2,iVar3);
        iVar2 = maskedBitReplace(iVar2,iVar2,stencilState->writeMask);
        iVar3 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar5 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar2,frag._4_4_ % numSamplesPerFragment,iVar3,iVar5);
      }
    }
    break;
  case STENCILOP_ZERO:
    for (local_48 = 0; local_48 < 0x40; local_48 = local_48 + 1) {
      if (((this->m_sampleRegister[local_48].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_48].depthPassed & 1U) == 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_48 / numSamplesPerFragment);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        iVar2 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_48 % numSamplesPerFragment,iVar2,iVar3);
        iVar2 = maskedBitReplace(iVar2,0,stencilState->writeMask);
        iVar3 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar5 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar2,local_48 % numSamplesPerFragment,iVar3,iVar5);
      }
    }
    break;
  case STENCILOP_REPLACE:
    for (local_60 = 0; local_60 < 0x40; local_60 = local_60 + 1) {
      if (((this->m_sampleRegister[local_60].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_60].depthPassed & 1U) == 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_60 / numSamplesPerFragment);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        iVar2 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_60 % numSamplesPerFragment,iVar2,iVar3);
        iVar2 = maskedBitReplace(iVar2,iVar1,stencilState->writeMask);
        iVar3 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar5 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar2,local_60 % numSamplesPerFragment,iVar3,iVar5);
      }
    }
    break;
  case STENCILOP_INCR:
    for (local_78 = 0; local_78 < 0x40; local_78 = local_78 + 1) {
      if (((this->m_sampleRegister[local_78].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_78].depthPassed & 1U) == 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_78 / numSamplesPerFragment);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        iVar2 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_78 % numSamplesPerFragment,iVar2,iVar3);
        iVar3 = de::clamp<int>(iVar2 + 1,0,(1 << ((byte)regSampleNdx & 0x1f)) + -1);
        iVar2 = maskedBitReplace(iVar2,iVar3,stencilState->writeMask);
        iVar3 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar5 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar2,local_78 % numSamplesPerFragment,iVar3,iVar5);
      }
    }
    break;
  case STENCILOP_DECR:
    for (local_90 = 0; local_90 < 0x40; local_90 = local_90 + 1) {
      if (((this->m_sampleRegister[local_90].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_90].depthPassed & 1U) == 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_90 / numSamplesPerFragment);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        iVar2 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_90 % numSamplesPerFragment,iVar2,iVar3);
        iVar3 = de::clamp<int>(iVar2 + -1,0,(1 << ((byte)regSampleNdx & 0x1f)) + -1);
        iVar2 = maskedBitReplace(iVar2,iVar3,stencilState->writeMask);
        iVar3 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar5 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar2,local_90 % numSamplesPerFragment,iVar3,iVar5);
      }
    }
    break;
  case STENCILOP_INCR_WRAP:
    for (local_a8 = 0; local_a8 < 0x40; local_a8 = local_a8 + 1) {
      if (((this->m_sampleRegister[local_a8].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_a8].depthPassed & 1U) == 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_a8 / numSamplesPerFragment);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        iVar2 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_a8 % numSamplesPerFragment,iVar2,iVar3);
        iVar2 = maskedBitReplace(iVar2,iVar2 + 1U & (1 << ((byte)regSampleNdx & 0x1f)) - 1U,
                                 stencilState->writeMask);
        iVar3 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar5 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar2,local_a8 % numSamplesPerFragment,iVar3,iVar5);
      }
    }
    break;
  case STENCILOP_DECR_WRAP:
    for (local_c0 = 0; local_c0 < 0x40; local_c0 = local_c0 + 1) {
      if (((this->m_sampleRegister[local_c0].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_c0].depthPassed & 1U) == 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_c0 / numSamplesPerFragment);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        iVar2 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_c0 % numSamplesPerFragment,iVar2,iVar3);
        iVar2 = maskedBitReplace(iVar2,iVar2 - 1U & (1 << ((byte)regSampleNdx & 0x1f)) - 1U,
                                 stencilState->writeMask);
        iVar3 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar5 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar2,local_c0 % numSamplesPerFragment,iVar3,iVar5);
      }
    }
    break;
  case STENCILOP_INVERT:
    for (local_d8 = 0; local_d8 < 0x40; local_d8 = local_d8 + 1) {
      if (((this->m_sampleRegister[local_d8].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_d8].depthPassed & 1U) == 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_d8 / numSamplesPerFragment);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        uVar4 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_d8 % numSamplesPerFragment,iVar2,iVar3);
        iVar2 = maskedBitReplace(uVar4,(uVar4 ^ 0xffffffff) &
                                       (1 << ((byte)regSampleNdx & 0x1f)) - 1U,
                                 stencilState->writeMask);
        iVar3 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar5 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar2,local_d8 % numSamplesPerFragment,iVar3,iVar5);
      }
    }
  }
  switch(stencilState->dpPass) {
  case STENCILOP_KEEP:
    for (local_f0 = 0; local_f0 < 0x40; local_f0 = local_f0 + 1) {
      if (((this->m_sampleRegister[local_f0].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_f0].depthPassed & 1U) != 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_f0 / numSamplesPerFragment);
        iVar1 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar2 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        iVar1 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_f0 % numSamplesPerFragment,iVar1,iVar2);
        iVar1 = maskedBitReplace(iVar1,iVar1,stencilState->writeMask);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar1,local_f0 % numSamplesPerFragment,iVar2,iVar3);
      }
    }
    break;
  case STENCILOP_ZERO:
    for (local_108 = 0; local_108 < 0x40; local_108 = local_108 + 1) {
      if (((this->m_sampleRegister[local_108].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_108].depthPassed & 1U) != 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_108 / numSamplesPerFragment);
        iVar1 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar2 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        iVar1 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_108 % numSamplesPerFragment,iVar1,iVar2);
        iVar1 = maskedBitReplace(iVar1,0,stencilState->writeMask);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar1,local_108 % numSamplesPerFragment,iVar2,iVar3);
      }
    }
    break;
  case STENCILOP_REPLACE:
    for (local_120 = 0; local_120 < 0x40; local_120 = local_120 + 1) {
      if (((this->m_sampleRegister[local_120].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_120].depthPassed & 1U) != 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_120 / numSamplesPerFragment);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        iVar2 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_120 % numSamplesPerFragment,iVar2,iVar3);
        iVar2 = maskedBitReplace(iVar2,iVar1,stencilState->writeMask);
        iVar3 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar5 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar2,local_120 % numSamplesPerFragment,iVar3,iVar5);
      }
    }
    break;
  case STENCILOP_INCR:
    for (local_138 = 0; local_138 < 0x40; local_138 = local_138 + 1) {
      if (((this->m_sampleRegister[local_138].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_138].depthPassed & 1U) != 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_138 / numSamplesPerFragment);
        iVar1 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar2 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        iVar1 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_138 % numSamplesPerFragment,iVar1,iVar2);
        iVar2 = de::clamp<int>(iVar1 + 1,0,(1 << ((byte)regSampleNdx & 0x1f)) + -1);
        iVar1 = maskedBitReplace(iVar1,iVar2,stencilState->writeMask);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar1,local_138 % numSamplesPerFragment,iVar2,iVar3);
      }
    }
    break;
  case STENCILOP_DECR:
    for (local_150 = 0; local_150 < 0x40; local_150 = local_150 + 1) {
      if (((this->m_sampleRegister[local_150].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_150].depthPassed & 1U) != 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_150 / numSamplesPerFragment);
        iVar1 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar2 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        iVar1 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_150 % numSamplesPerFragment,iVar1,iVar2);
        iVar2 = de::clamp<int>(iVar1 + -1,0,(1 << ((byte)regSampleNdx & 0x1f)) + -1);
        iVar1 = maskedBitReplace(iVar1,iVar2,stencilState->writeMask);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar1,local_150 % numSamplesPerFragment,iVar2,iVar3);
      }
    }
    break;
  case STENCILOP_INCR_WRAP:
    for (local_168 = 0; local_168 < 0x40; local_168 = local_168 + 1) {
      if (((this->m_sampleRegister[local_168].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_168].depthPassed & 1U) != 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_168 / numSamplesPerFragment);
        iVar1 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar2 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        iVar1 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_168 % numSamplesPerFragment,iVar1,iVar2);
        iVar1 = maskedBitReplace(iVar1,iVar1 + 1U & (1 << ((byte)regSampleNdx & 0x1f)) - 1U,
                                 stencilState->writeMask);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar1,local_168 % numSamplesPerFragment,iVar2,iVar3);
      }
    }
    break;
  case STENCILOP_DECR_WRAP:
    for (local_180 = 0; local_180 < 0x40; local_180 = local_180 + 1) {
      if (((this->m_sampleRegister[local_180].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_180].depthPassed & 1U) != 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_180 / numSamplesPerFragment);
        iVar1 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar2 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        iVar1 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_180 % numSamplesPerFragment,iVar1,iVar2);
        iVar1 = maskedBitReplace(iVar1,iVar1 - 1U & (1 << ((byte)regSampleNdx & 0x1f)) - 1U,
                                 stencilState->writeMask);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar1,local_180 % numSamplesPerFragment,iVar2,iVar3);
      }
    }
    break;
  case STENCILOP_INVERT:
    for (local_198 = 0; local_198 < 0x40; local_198 = local_198 + 1) {
      if (((this->m_sampleRegister[local_198].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_198].depthPassed & 1U) != 0)) {
        pFVar6 = inputFragments + (fragNdxOffset + local_198 / numSamplesPerFragment);
        iVar1 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar2 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        uVar4 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_198 % numSamplesPerFragment,iVar1,iVar2);
        iVar1 = maskedBitReplace(uVar4,(uVar4 ^ 0xffffffff) &
                                       (1 << ((byte)regSampleNdx & 0x1f)) - 1U,
                                 stencilState->writeMask);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar6->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar6->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar1,local_198 % numSamplesPerFragment,iVar2,iVar3);
      }
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeStencilDpFailAndPass (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const StencilState& stencilState, int numStencilBits, const tcu::PixelBufferAccess& stencilBuffer)
{
#define SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, EXPRESSION)																													\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)																								\
	{																																											\
		if (m_sampleRegister[regSampleNdx].isAlive && (CONDITION))																												\
		{																																										\
			int					fragSampleNdx		= regSampleNdx % numSamplesPerFragment;																						\
			const Fragment&		frag				= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];														\
			int					stencilBufferValue	= stencilBuffer.getPixStencil(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());										\
																																												\
			stencilBuffer.setPixStencil(maskedBitReplace(stencilBufferValue, (EXPRESSION), stencilState.writeMask), fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());	\
		}																																										\
	}

#define SWITCH_DPFAIL_OR_DPPASS(OP_NAME, CONDITION)																											\
		switch (stencilState.OP_NAME)																														\
		{																																					\
			case STENCILOP_KEEP:		SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, stencilBufferValue)												break;	\
			case STENCILOP_ZERO:		SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, 0)																break;	\
			case STENCILOP_REPLACE:		SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, clampedStencilRef)												break;	\
			case STENCILOP_INCR:		SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, de::clamp(stencilBufferValue+1, 0, (1<<numStencilBits) - 1))	break;	\
			case STENCILOP_DECR:		SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, de::clamp(stencilBufferValue-1, 0, (1<<numStencilBits) - 1))	break;	\
			case STENCILOP_INCR_WRAP:	SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, (stencilBufferValue + 1) & ((1<<numStencilBits) - 1))			break;	\
			case STENCILOP_DECR_WRAP:	SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, (stencilBufferValue - 1) & ((1<<numStencilBits) - 1))			break;	\
			case STENCILOP_INVERT:		SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, (~stencilBufferValue) & ((1<<numStencilBits) - 1))				break;	\
			default:																																		\
				DE_ASSERT(false);																															\
		}

	int clampedStencilRef = de::clamp(stencilState.ref, 0, (1<<numStencilBits)-1);

	SWITCH_DPFAIL_OR_DPPASS(dpFail, !m_sampleRegister[regSampleNdx].depthPassed)
	SWITCH_DPFAIL_OR_DPPASS(dpPass, m_sampleRegister[regSampleNdx].depthPassed)

#undef SWITCH_DPFAIL_OR_DPPASS
#undef SAMPLE_REGISTER_DPFAIL_OR_DPPASS
}